

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O3

long __thiscall cpp_client::Base_game::go(Base_game *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  size_type *extraout_RAX;
  size_type *extraout_RAX_00;
  size_type *psVar7;
  uint uVar8;
  size_type *psVar9;
  _Alloc_hider *__n;
  _func_int **pp_Var10;
  _func_int **__n_00;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer __buf;
  ulong uVar11;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  pointer *__ptr_4;
  int __flags;
  uint __len;
  pointer *__ptr_1;
  pointer *__ptr;
  string to_send;
  anon_class_8_1_3e8781ac add_standard_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> game_name;
  string alias;
  undefined1 local_f0 [32];
  string local_d0;
  anon_class_8_1_3e8781ac local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long local_98 [2];
  undefined1 local_88 [32];
  undefined8 local_68;
  _Alloc_hider local_60;
  _Alloc_hider local_58;
  undefined1 auStack_50 [16];
  undefined1 local_40 [16];
  
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[10])(&local_d0);
  __flags = 0x1c;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x12c0b8);
  psVar7 = (size_type *)(local_88 + 0x10);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    local_88._16_8_ = *psVar9;
    local_88._24_8_ = plVar6[3];
    local_88._0_8_ = psVar7;
  }
  else {
    local_88._16_8_ = *psVar9;
    local_88._0_8_ = (size_type *)*plVar6;
  }
  local_88._8_8_ = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_88);
  local_68 = &local_58;
  __n = (_Alloc_hider *)(plVar6 + 2);
  if ((_Alloc_hider *)*plVar6 == __n) {
    local_58._M_p = __n->_M_p;
    auStack_50._0_8_ = plVar6[3];
  }
  else {
    local_58._M_p = __n->_M_p;
    local_68 = (_Alloc_hider *)*plVar6;
  }
  __buf = (pointer)plVar6[1];
  *plVar6 = (long)__n;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_60._M_p = __buf;
  if ((size_type *)local_88._0_8_ != psVar7) {
    operator_delete((void *)local_88._0_8_);
    __buf = extraout_RDX;
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
    __buf = extraout_RDX_00;
  }
  Connection::send(&this->conn_,(int)&local_68,__buf,(size_t)__n,__flags);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"named","");
  handle_response((Base_game *)local_f0,(string *)this);
  plVar6 = (long *)(**(code **)(*(long *)*(_func_int **)local_f0._0_8_ + 0x18))();
  local_88._0_8_ = psVar7;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,*plVar6,plVar6[1] + *plVar6);
  if (*(_func_int **)local_f0._0_8_ != (_func_int *)0x0) {
    (**(code **)(*(long *)*(_func_int **)local_f0._0_8_ + 8))();
  }
  operator_delete((void *)local_f0._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "{\"event\": \"play\", \"data\": {\"clientType\": \"c++\", \"playerIndex\": ","");
  uVar2 = this->player_index_;
  if (uVar2 == 0xffffffff) {
    std::__cxx11::string::append((char *)&local_d0);
  }
  else {
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar11 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar8 = (uint)uVar11;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_00118436;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_00118436;
        }
        if (uVar8 < 10000) goto LAB_00118436;
        uVar11 = uVar11 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_00118436:
    local_a8._M_allocated_capacity = (size_type)local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((uVar2 >> 0x1f) + local_a8._M_allocated_capacity),__len,__val);
    plVar6 = (long *)std::__cxx11::string::append(local_a8._M_local_buf);
    pp_Var10 = (_func_int **)(plVar6 + 2);
    if ((_func_int **)*plVar6 == pp_Var10) {
      local_f0._16_8_ = *pp_Var10;
      local_f0._24_8_ = plVar6[3];
      local_f0._0_8_ = local_f0 + 0x10;
    }
    else {
      local_f0._16_8_ = *pp_Var10;
      local_f0._0_8_ = (_func_int **)*plVar6;
    }
    local_f0._8_8_ =
         ((_Tuple_impl<0UL,_cpp_client::Delta_mergable_delay_variables_*,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
           *)(plVar6 + 1))->
         super__Head_base<0UL,_cpp_client::Delta_mergable_delay_variables_*,_false>;
    *plVar6 = (long)pp_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,local_f0._0_8_);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_);
    }
    if ((long *)local_a8._M_allocated_capacity != local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
  }
  local_b0.to_send = &local_d0;
  pp_Var10 = (_func_int **)(local_f0 + 0x10);
  local_f0._0_8_ = pp_Var10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"password","");
  go::anon_class_8_1_3e8781ac::operator()(&local_b0,(string *)local_f0,&this->password_);
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pp_Var10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"requestedSession","");
  go::anon_class_8_1_3e8781ac::operator()(&local_b0,(string *)local_f0,&this->session_);
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pp_Var10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"gameSettings","");
  go::anon_class_8_1_3e8781ac::operator()(&local_b0,(string *)local_f0,&this->game_settings_);
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
  }
  std::__cxx11::string::append((char *)&local_d0);
  iVar5 = std::__cxx11::string::compare((char *)&this->name_);
  if (iVar5 == 0) {
    (**((this->ai_)._M_t.
        super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>._M_t.
        super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
        super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl)->_vptr_Base_ai)(local_f0);
    std::__cxx11::string::_M_append((char *)&local_d0,local_f0._0_8_);
    if ((_func_int **)local_f0._0_8_ != pp_Var10) {
      operator_delete((void *)local_f0._0_8_);
    }
  }
  else {
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(this->name_)._M_dataplus._M_p);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                 "\",\"gameName\":\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  plVar6 = (long *)std::__cxx11::string::append(local_a8._M_local_buf);
  __n_00 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == __n_00) {
    local_f0._16_8_ = *__n_00;
    local_f0._24_8_ = plVar6[3];
    local_f0._0_8_ = pp_Var10;
  }
  else {
    local_f0._16_8_ = *__n_00;
    local_f0._0_8_ = (_func_int **)*plVar6;
  }
  local_f0._8_8_ = plVar6[1];
  *plVar6 = (long)__n_00;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_d0,local_f0._0_8_);
  __buf_00 = extraout_RDX_01;
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
    __buf_00 = extraout_RDX_02;
  }
  if ((long *)local_a8._M_allocated_capacity != local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
    __buf_00 = extraout_RDX_03;
  }
  Connection::send(&this->conn_,(int)&local_d0,__buf_00,(size_t)__n_00,__flags);
  local_f0._0_8_ = pp_Var10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"lobbied","");
  handle_response((Base_game *)(local_40 + 8),(string *)this);
  if ((Delta_mergable_delay_variables *)local_40._8_8_ != (Delta_mergable_delay_variables *)0x0) {
    if (*(long **)local_40._8_8_ != (long *)0x0) {
      (**(code **)(**(long **)local_40._8_8_ + 8))();
    }
    operator_delete((void *)local_40._8_8_);
  }
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pp_Var10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"delta","");
  handle_response((Base_game *)local_40,(string *)this);
  if ((long *)local_40._0_8_ != (long *)0x0) {
    if (*(long **)local_40._0_8_ != (long *)0x0) {
      (**(code **)(**(long **)local_40._0_8_ + 8))();
    }
    operator_delete((void *)local_40._0_8_);
  }
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pp_Var10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"start","");
  handle_response((Base_game *)(auStack_50 + 8),(string *)this);
  if ((long *)auStack_50._8_8_ != (long *)0x0) {
    if (*(long **)auStack_50._8_8_ != (long *)0x0) {
      (**(code **)(**(long **)auStack_50._8_8_ + 8))();
    }
    operator_delete((void *)auStack_50._8_8_);
  }
  if ((_func_int **)local_f0._0_8_ != pp_Var10) {
    operator_delete((void *)local_f0._0_8_);
  }
  do {
    local_f0._0_8_ = pp_Var10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"","");
    handle_response((Base_game *)&local_a8,(string *)this);
    uVar3 = local_a8._M_allocated_capacity;
    plVar6 = *(long **)local_a8._M_allocated_capacity;
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    operator_delete((void *)uVar3);
    if ((_func_int **)local_f0._0_8_ != pp_Var10) {
      operator_delete((void *)local_f0._0_8_);
    }
  } while (plVar6 != (long *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  psVar7 = (size_type *)(local_88 + 0x10);
  if ((size_type *)local_88._0_8_ != psVar7) {
    operator_delete((void *)local_88._0_8_);
    psVar7 = extraout_RAX;
  }
  if ((_Alloc_hider *)local_68 != &local_58) {
    operator_delete((void *)local_68);
    psVar7 = extraout_RAX_00;
  }
  return (long)psVar7;
}

Assistant:

void Base_game::go()
{
   //grab the name first (do this again to ensure proper server-side name)
   std::string alias = R"({"event": "alias", "data": ")" + get_game_name() + "\"}";
   conn_.send(alias);
   const auto game_name = handle_response("named")->as<std::string>();
   //start with the same thing each time
   std::string to_send = R"({"event": "play", "data": {"clientType": "c++", "playerIndex": )";
   //now fill in the details
   if(player_index_ == -1)
   {
      to_send += "null,";
   }
   else
   {
      to_send += std::to_string(player_index_) + ",";
   }
   const auto add_standard_str = [&to_send](const std::string& name, const std::string& to_add)
      {
         to_send += "\"" + name + "\":";
         if(to_add == "")
         {
            to_send += "null,";
         }
         else
         {
            to_send += "\"" + to_add + "\",";
         }
      };
   add_standard_str("password", password_);
   add_standard_str("requestedSession", session_);
   add_standard_str("gameSettings", game_settings_);
   to_send += R"("playerName":")";
   if(name_ == "")
   {
      to_send += ai_->get_name();
   }
   else
   {
      to_send += name_;
   }
   to_send += R"(","gameName":")" + game_name + R"("}})";
   conn_.send(to_send);
   //Expecting the "lobbied" message
   handle_response("lobbied");
   //Next the delta message will be received
   handle_response("delta");
   //Start should be next
   handle_response("start");
   //now just do normal handling of events
   while(*handle_response())
   {
      //Intentionally empty
   }
}